

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectoryRecord.test.cpp
# Opt level: O1

void verifyChunk(DirectoryRecord *chunk)

{
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  AssertionHandler catchAssertionHandler;
  ITransientExpression local_a0;
  char *local_90;
  undefined8 local_88;
  _Head_base<3UL,_long,_false> local_80;
  AssertionHandler local_78;
  
  local_a0._vptr_ITransientExpression = (_func_int **)0x18a3ac;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0xf;
  capturedExpression.m_start = "1 == chunk.MF()";
  Catch::AssertionHandler::AssertionHandler
            (&local_78,macroName,(SourceLineInfo *)&local_a0,capturedExpression,ContinueOnFailure);
  local_80._M_head_impl =
       (chunk->
       super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
       ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>.
       _M_head_impl;
  local_a0.m_result = local_80._M_head_impl == 1;
  local_a0.m_isBinaryExpression = true;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c03e8;
  local_a0._12_4_ = 1;
  local_90 = "==";
  local_88 = 2;
  Catch::AssertionHandler::handleExpr(&local_78,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&local_78);
  if (local_78.m_completed == false) {
    (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_a0._vptr_ITransientExpression = (_func_int **)0x18a3ac;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x11;
  capturedExpression_00.m_start = "451 == chunk.MT()";
  Catch::AssertionHandler::AssertionHandler
            (&local_78,macroName_00,(SourceLineInfo *)&local_a0,capturedExpression_00,
             ContinueOnFailure);
  local_80._M_head_impl =
       (chunk->
       super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
       ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_long,_long,_long>.super__Head_base<1UL,_long,_false>._M_head_impl;
  local_a0.m_result = local_80._M_head_impl == 0x1c3;
  local_a0.m_isBinaryExpression = true;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c03e8;
  local_a0._12_4_ = 0x1c3;
  local_90 = "==";
  local_88 = 2;
  Catch::AssertionHandler::handleExpr(&local_78,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&local_78);
  if (local_78.m_completed == false) {
    (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_a0._vptr_ITransientExpression = (_func_int **)0x18a3ac;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x11;
  capturedExpression_01.m_start = "101 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&local_78,macroName_01,(SourceLineInfo *)&local_a0,capturedExpression_01,
             ContinueOnFailure);
  local_80._M_head_impl =
       (chunk->
       super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
       ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
       super__Head_base<2UL,_long,_false>._M_head_impl;
  local_a0.m_result = local_80._M_head_impl == 0x65;
  local_a0.m_isBinaryExpression = true;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c03e8;
  local_a0._12_4_ = 0x65;
  local_90 = "==";
  local_88 = 2;
  Catch::AssertionHandler::handleExpr(&local_78,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&local_78);
  if (local_78.m_completed == false) {
    (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_a0._vptr_ITransientExpression = (_func_int **)0x18a3ac;
  local_a0.m_isBinaryExpression = true;
  local_a0.m_result = false;
  local_a0._10_6_ = 0;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x10;
  capturedExpression_02.m_start = "5 == chunk.MOD()";
  Catch::AssertionHandler::AssertionHandler
            (&local_78,macroName_02,(SourceLineInfo *)&local_a0,capturedExpression_02,
             ContinueOnFailure);
  local_80._M_head_impl =
       (chunk->
       super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
       ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
       super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl;
  local_a0.m_result = local_80._M_head_impl == 5;
  local_a0.m_isBinaryExpression = true;
  local_a0._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c03e8;
  local_a0._12_4_ = 5;
  local_90 = "==";
  local_88 = 2;
  Catch::AssertionHandler::handleExpr(&local_78,&local_a0);
  Catch::ITransientExpression::~ITransientExpression(&local_a0);
  Catch::AssertionHandler::complete(&local_78);
  if (local_78.m_completed == false) {
    (*(local_78.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunk( const DirectoryRecord& chunk ) {

  CHECK( 1 == chunk.MF() );
  CHECK( 451 == chunk.MT() );
  CHECK( 101 == chunk.NC() );
  CHECK( 5 == chunk.MOD() );
}